

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZGeoBlend<pzgeom::TPZGeoCube> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  long lVar1;
  
  TPZNodeRep<8,_pztopology::TPZCube>::TPZNodeRep
            ((TPZNodeRep<8,_pztopology::TPZCube> *)this,&PTR_PTR_018b6330,
             (TPZNodeRep<8,_pztopology::TPZCube> *)cp,gl2lcNdMap);
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b62d0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x230 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x2080);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please implement me\n",0x14);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }